

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  Node *pNVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Node *pNVar5;
  Node *unaff_R15;
  
  pNVar5 = this->head_;
  uVar4 = *(int *)&(this->max_height_).rep_ - 1;
  do {
    if (pNVar5 != this->head_) {
      iVar3 = MemTable::KeyComparator::operator()(&this->compare_,pNVar5->key,*key);
      if (-1 < iVar3) {
        __assert_fail("x == head_ || compare_(x->key, key) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/skiplist.h"
                      ,0x128,
                      "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                     );
      }
    }
    if ((int)uVar4 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/skiplist.h"
                    ,0xa0,
                    "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
    pNVar1 = (Node *)pNVar5->next_[uVar4].rep_;
    if (pNVar1 == (Node *)0x0) {
LAB_0011084a:
      if (uVar4 == 0) {
        uVar4 = 0;
        bVar2 = false;
        unaff_R15 = pNVar5;
      }
      else {
        uVar4 = uVar4 - 1;
        bVar2 = true;
      }
    }
    else {
      iVar3 = MemTable::KeyComparator::operator()(&this->compare_,pNVar1->key,*key);
      if (-1 < iVar3) goto LAB_0011084a;
      bVar2 = true;
      pNVar5 = pNVar1;
    }
    if (!bVar2) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node *
    SkipList<Key, Comparator>::FindLessThan(const Key &key) const {
        Node *x = head_;
        int level = GetMaxHeight() - 1;
        while (true) {
            assert(x == head_ || compare_(x->key, key) < 0);
            Node *next = x->Next(level);
            if (next == NULL || compare_(next->key, key) >= 0) {
                if (level == 0) {
                    return x;
                } else {
                    // Switch to next list
                    level--;
                }
            } else {
                x = next;
            }
        }
    }